

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncEndianness(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  Endianness EVar1;
  allocator<char> local_e9;
  string local_e8;
  StringLiteral local_c8;
  undefined4 local_a8;
  allocator<char> local_a1;
  string local_a0;
  StringLiteral local_80;
  undefined1 local_50 [8];
  ExpressionValue result;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  result.strValue._value.field_2._8_8_ = parameters;
  ExpressionValue::ExpressionValue((ExpressionValue *)local_50);
  local_50._0_4_ = String;
  EVar1 = FileManager::getEndianness(g_fileManager);
  if (EVar1 == Big) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"big",&local_e9);
    StringLiteral::StringLiteral(&local_c8,&local_e8);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_c8);
    StringLiteral::~StringLiteral(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  else if (EVar1 == Little) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"little",&local_a1);
    StringLiteral::StringLiteral(&local_80,&local_a0);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_80);
    StringLiteral::~StringLiteral(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  local_a8 = 1;
  ExpressionValue::~ExpressionValue((ExpressionValue *)local_50);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncEndianness(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	result.type = ExpressionValueType::String;

	switch (g_fileManager->getEndianness())
	{
	case Endianness::Little:
		return ExpressionValue(StringLiteral("little"));
	case Endianness::Big:
		return ExpressionValue(StringLiteral("big"));
	}

	return ExpressionValue();
}